

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void bitset_set_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  _Bool _Var1;
  uint64_t length_local;
  uint16_t *list_local;
  uint64_t *words_local;
  
  _Var1 = croaring_avx2();
  if (_Var1) {
    _asm_bitset_set_list(words,list,length);
  }
  else {
    _scalar_bitset_set_list(words,list,length);
  }
  return;
}

Assistant:

void bitset_set_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    if( croaring_avx2() ) {
        _asm_bitset_set_list(words, list, length);
    } else {
        _scalar_bitset_set_list(words, list, length);
    }
}